

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoreboard.cpp
# Opt level: O2

void __thiscall CScoreboard::RenderNetworkQuality(CScoreboard *this,float x,float w)

{
  long lVar1;
  IGraphics *pIVar2;
  ITextRender *pIVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  float local_8c;
  vec4 local_88;
  CUIRect local_78;
  float local_68 [4];
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  CUIRect RectBox;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RectBox.y = 0.0;
  RectBox.h = 50.0;
  local_58.x = 0.0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0x3ecccccd;
  RectBox.x = x;
  RectBox.w = w;
  iVar4 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface)._vptr_IInterface
            [0x12])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  CUIRect::Draw(&RectBox,(vec4 *)&local_58,15.0,0xc);
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])
            (pIVar2,(ulong)(uint)g_pData->m_aImages[0x15].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xa2,0,0,0);
  local_68[0] = x + 20.0;
  local_68[1] = 12.5;
  local_68[2] = 25.0;
  local_68[3] = 25.0;
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,local_68,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (RenderNetworkQuality(float,float)::s_Cursor == '\0') {
    iVar5 = __cxa_guard_acquire(&RenderNetworkQuality(float,float)::s_Cursor);
    if (iVar5 != 0) {
      CTextCursor::CTextCursor(&RenderNetworkQuality::s_Cursor,20.0,0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderNetworkQuality::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderNetworkQuality(float,float)::s_Cursor);
    }
  }
  CTextCursor::Reset(&RenderNetworkQuality::s_Cursor,0);
  RenderNetworkQuality::s_Cursor.m_CursorPos.field_1.y = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  RenderNetworkQuality::s_Cursor.m_CursorPos.field_0.x = x + 50.0;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
            (pIVar3,&RenderNetworkQuality::s_Cursor,"NET",0xffffffffffffffff);
  local_8c = x + 50.0 + 50.0 + -4.0;
  iVar5 = 2;
  for (lVar6 = 0; (lVar6 != 0x14 && (iVar4 <= *(int *)((long)&DAT_001cc720 + lVar6)));
      lVar6 = lVar6 + 4) {
    local_8c = local_8c + 9.0;
    local_78.w = 6.0;
    local_78.h = ((float)iVar5 * 17.0) / 5.0 + 1.0;
    local_78.y = 34.0 - local_78.h;
    local_88._0_8_ = 0x3f6666663f666666;
    local_88.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f666666;
    local_88.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    local_78.x = local_8c;
    CUIRect::Draw(&local_78,&local_88,0.0,0);
    iVar5 = iVar5 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CScoreboard::RenderNetworkQuality(float x, float w)
{
	//draw the box
	CUIRect RectBox = {x, 0.0f, w, 50.0f};
	vec4 Color = vec4(0.0f, 0.0f, 0.0f, 0.4f);
	const float LineHeight = 17.0f;
	int Score = Client()->GetInputtimeMarginStabilityScore();

	Graphics()->BlendNormal();
	RectBox.Draw(Color, 15.0f, CUIRect::CORNER_B);
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_NETWORKICONS].m_Id);
	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(SPRITE_NETWORK_GOOD);
	IGraphics::CQuadItem QuadItem(x+20.0f, 12.5f, 25.0f, 25.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	x += 50.0f;
	static CTextCursor s_Cursor(20.0f);
	s_Cursor.Reset(0);
	s_Cursor.MoveTo(x, 10.0f);
	TextRender()->TextOutlined(&s_Cursor, "NET", -1);
	x += 50.0f;
	float y = 0.0f;

	const int NumBars = 5;
	int ScoreThresolds[NumBars] = {INT_MAX, 1000, 250, 50, -80};
	CUIRect BarRect = {
		x - 4.0f,
		y + LineHeight,
		6.0f,
		LineHeight
	};

	for(int Bar = 0; Bar < NumBars && Score <= ScoreThresolds[Bar]; Bar++)
	{
		BarRect.x += BarRect.w + 3.0f;
		CUIRect LocalBarRect = BarRect;
		LocalBarRect.h = BarRect.h*(Bar+2)/(float)NumBars+1.0f;
		LocalBarRect.y = BarRect.y + BarRect.h - LocalBarRect.h;
		LocalBarRect.Draw(vec4(0.9f,0.9f,0.9f,1.0f), 0.0f, CUIRect::CORNER_NONE);
	}
}